

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

raw_problem_status read_quadratic_element(stream_buffer *buf,problem_parser *p,double sign_factor)

{
  double dVar1;
  raw_problem_status rVar2;
  anon_class_8_2_43e298a6_for__M_pred __pred;
  bool bVar3;
  int iVar4;
  int iVar5;
  anon_class_4_1_3fcf65d9_for__M_pred __pred_00;
  function_element_token *pfVar6;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  pointer poVar8;
  string_view sVar9;
  string_view sVar10;
  string_view sVar11;
  byte local_2e9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2b8;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_298;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  reference local_278;
  value_type *ret_1;
  int local_264;
  objective_quadratic_element *local_260;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  local_258;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  local_250;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  it_1;
  undefined1 auStack_228 [4];
  int id;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  reference local_1a8;
  value_type *ret;
  int local_198;
  int iStack_194;
  objective_quadratic_element *local_190;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  local_188;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  local_180;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  it;
  int id2;
  int id1;
  undefined1 local_130 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name_opt;
  undefined1 local_c8 [8];
  optional<function_element_token> fct_opt;
  function_element_token fct;
  string_view local_60;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  double local_30;
  double sign_factor_local;
  problem_parser *p_local;
  stream_buffer *buf_local;
  undefined4 uStack_10;
  uint local_c;
  
  local_30 = sign_factor;
  sign_factor_local = (double)p;
  p_local = (problem_parser *)buf;
  local_40 = stream_buffer::first(buf);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"[");
  bVar3 = std::operator==(local_40,local_50);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    stream_buffer::pop_front((stream_buffer *)p_local);
LAB_001554a6:
    local_60 = stream_buffer::first((stream_buffer *)p_local);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_60);
    local_2e9 = 0;
    if (!bVar3) {
      sVar9 = stream_buffer::first((stream_buffer *)p_local);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&fct.read,"]");
      bVar3 = std::operator==(sVar9,stack0xffffffffffffff80);
      local_2e9 = bVar3 ^ 0xff;
    }
    if ((local_2e9 & 1) == 0) {
      stream_buffer::pop_front((stream_buffer *)p_local);
      local_288 = stream_buffer::first((stream_buffer *)p_local);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_298,"/");
      bVar3 = std::operator==(local_288,local_298);
      if (bVar3) {
        local_2a8 = stream_buffer::second((stream_buffer *)p_local);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b8,"2");
        bVar3 = std::operator==(local_2a8,local_2b8);
        if (!bVar3) goto LAB_00155c8a;
        stream_buffer::pop_front((stream_buffer *)p_local,2);
      }
      else {
LAB_00155c8a:
        local_2c8 = stream_buffer::first((stream_buffer *)p_local);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"/2");
        bVar3 = std::operator==(local_2c8,local_2d8);
        if (!bVar3) {
          raw_problem_status::raw_problem_status
                    ((raw_problem_status *)((long)&buf_local + 4),bad_objective_quadratic);
          goto LAB_00155d0a;
        }
        stream_buffer::pop_front((stream_buffer *)p_local,1);
      }
      raw_problem_status::raw_problem_status((raw_problem_status *)((long)&buf_local + 4),success);
      goto LAB_00155d0a;
    }
    function_element_token::function_element_token
              ((function_element_token *)
               &fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
                super__Optional_payload_base<function_element_token>._M_engaged);
    sVar9 = stream_buffer::first((stream_buffer *)p_local);
    sVar10 = stream_buffer::second((stream_buffer *)p_local);
    sVar11 = stream_buffer::third((stream_buffer *)p_local);
    read_quadratic_element((optional<function_element_token> *)local_c8,sVar9,sVar10,sVar11);
    bVar3 = std::optional::operator_cast_to_bool((optional *)local_c8);
    if (!bVar3) {
      raw_problem_status::raw_problem_status
                ((raw_problem_status *)((long)&buf_local + 4),bad_objective_quadratic);
      goto LAB_00155d0a;
    }
    pfVar6 = std::optional<function_element_token>::operator*
                       ((optional<function_element_token> *)local_c8);
    fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
    super__Optional_payload_base<function_element_token>._32_8_ = pfVar6->factor;
    fct.factor = (double)(pfVar6->name)._M_len;
    fct.name._M_len = (size_t)(pfVar6->name)._M_str;
    fct.name._M_str._0_4_ = pfVar6->read;
    stream_buffer::pop_front((stream_buffer *)p_local,(int)fct.name._M_str);
    sVar9 = stream_buffer::first((stream_buffer *)p_local);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &name_opt.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged,"*");
    bVar3 = std::operator==(sVar9,stack0xfffffffffffffee8);
    if (bVar3) {
      sVar9 = stream_buffer::second((stream_buffer *)p_local);
      read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_130,sVar9)
      ;
      bVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                        ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         local_130);
      if (!bVar3) {
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&buf_local + 4),bad_objective_quadratic);
        goto LAB_00155d0a;
      }
      sVar9._M_str = (char *)fct.name._M_len;
      sVar9._M_len = (size_t)fct.factor;
      iVar4 = problem_parser::get_or_assign_variable((problem_parser *)sign_factor_local,sVar9);
      dVar1 = sign_factor_local;
      pbVar7 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                         ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          local_130);
      it._M_current = (objective_quadratic_element *)pbVar7->_M_len;
      sVar10._M_len = pbVar7->_M_len;
      sVar10._M_str = pbVar7->_M_str;
      iVar5 = problem_parser::get_or_assign_variable((problem_parser *)dVar1,sVar10);
      if ((iVar4 == -1) || (iVar5 == -1)) {
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&buf_local + 4),too_many_variables);
        goto LAB_00155d0a;
      }
      local_188._M_current =
           (objective_quadratic_element *)
           std::
           vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ::begin((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    *)((long)sign_factor_local + 0x28));
      local_190 = (objective_quadratic_element *)
                  std::
                  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                  ::end((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                         *)((long)sign_factor_local + 0x28));
      __pred.id2 = iVar5;
      __pred.id1 = iVar4;
      local_198 = iVar4;
      iStack_194 = iVar5;
      local_180 = std::
                  find_if<__gnu_cxx::__normal_iterator<baryonyx::objective_quadratic_element*,std::vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>>,read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                            (local_188,
                             (__normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                              )local_190,__pred);
      ret = (value_type *)
            std::
            vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
            ::end((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   *)((long)sign_factor_local + 0x28));
      bVar3 = __gnu_cxx::
              operator==<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                        (&local_180,
                         (__normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                          *)&ret);
      if (bVar3) {
        local_1a8 = std::
                    vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    ::emplace_back<>((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                                      *)((long)sign_factor_local + 0x28));
        local_1a8->factor =
             ((double)fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
                      super__Optional_payload_base<function_element_token>._32_8_ * local_30) / 2.0;
        local_1a8->variable_index_a = iVar4;
        local_1a8->variable_index_b = iVar5;
      }
      else {
        dVar1 = (double)fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
                        super__Optional_payload_base<function_element_token>._32_8_ * local_30;
        poVar8 = __gnu_cxx::
                 __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                 ::operator->(&local_180);
        poVar8->factor = dVar1 / 2.0 + poVar8->factor;
      }
      stream_buffer::pop_front((stream_buffer *)p_local,2);
      goto LAB_001554a6;
    }
    local_1b8 = stream_buffer::first((stream_buffer *)p_local);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"^");
    bVar3 = std::operator==(local_1b8,local_1c8);
    if (!bVar3) {
      local_1d8 = stream_buffer::first((stream_buffer *)p_local);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"^2");
      bVar3 = std::operator==(local_1d8,local_1e8);
      if (!bVar3) goto LAB_001554a6;
    }
    local_1f8 = stream_buffer::first((stream_buffer *)p_local);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_208,"^");
    bVar3 = std::operator==(local_1f8,local_208);
    if (bVar3) {
      local_218 = stream_buffer::second((stream_buffer *)p_local);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_228,"2");
      bVar3 = std::operator==(local_218,_auStack_228);
      if (!bVar3) goto LAB_00155a1d;
      stream_buffer::pop_front((stream_buffer *)p_local,2);
    }
    else {
LAB_00155a1d:
      stream_buffer::pop_front((stream_buffer *)p_local,1);
    }
    it_1._M_current = (objective_quadratic_element *)fct.factor;
    sVar11._M_str = (char *)fct.name._M_len;
    sVar11._M_len = (size_t)fct.factor;
    __pred_00.id = problem_parser::get_or_assign_variable
                             ((problem_parser *)sign_factor_local,sVar11);
    if (__pred_00.id != -1) {
      local_258._M_current =
           (objective_quadratic_element *)
           std::
           vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ::begin((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    *)((long)sign_factor_local + 0x28));
      local_260 = (objective_quadratic_element *)
                  std::
                  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                  ::end((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                         *)((long)sign_factor_local + 0x28));
      local_264 = __pred_00.id;
      local_250 = std::
                  find_if<__gnu_cxx::__normal_iterator<baryonyx::objective_quadratic_element*,std::vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>>,read_quadratic_element(stream_buffer&,problem_parser&,double)::__1>
                            (local_258,
                             (__normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                              )local_260,__pred_00);
      ret_1 = (value_type *)
              std::
              vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
              ::end((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                     *)((long)sign_factor_local + 0x28));
      bVar3 = __gnu_cxx::
              operator==<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                        (&local_250,
                         (__normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                          *)&ret_1);
      if (bVar3) {
        local_278 = std::
                    vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    ::emplace_back<>((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                                      *)((long)sign_factor_local + 0x28));
        local_278->factor =
             ((double)fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
                      super__Optional_payload_base<function_element_token>._32_8_ * local_30) / 2.0;
        local_278->variable_index_a = __pred_00.id;
        local_278->variable_index_b = __pred_00.id;
      }
      else {
        dVar1 = (double)fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
                        super__Optional_payload_base<function_element_token>._32_8_ * local_30;
        poVar8 = __gnu_cxx::
                 __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                 ::operator->(&local_250);
        poVar8->factor = dVar1 / 2.0 + poVar8->factor;
      }
      goto LAB_001554a6;
    }
    raw_problem_status::raw_problem_status
              ((raw_problem_status *)((long)&buf_local + 4),too_many_variables);
  }
  else {
    raw_problem_status::raw_problem_status
              ((raw_problem_status *)((long)&buf_local + 4),bad_objective_quadratic);
  }
LAB_00155d0a:
  rVar2.column = local_c;
  rVar2.tag = buf_local._4_4_;
  rVar2.line = uStack_10;
  return rVar2;
}

Assistant:

raw_problem_status
read_quadratic_element(stream_buffer& buf,
                       problem_parser& p,
                       double sign_factor) noexcept
{
    if (buf.first() != "[")
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    buf.pop_front();

    while (!buf.first().empty() && buf.first() != "]") {
        function_element_token fct;

        if (auto fct_opt =
              read_quadratic_element(buf.first(), buf.second(), buf.third());
            !fct_opt)
            return baryonyx::file_format_error_tag::bad_objective_quadratic;
        else
            fct = *fct_opt;

        buf.pop_front(fct.read);

        if (buf.first() == "*") {
            auto name_opt = read_name(buf.second());
            if (!name_opt.has_value())
                return baryonyx::file_format_error_tag::
                  bad_objective_quadratic;

            auto id1 = p.get_or_assign_variable(fct.name);
            auto id2 = p.get_or_assign_variable(*name_opt);

            if (id1 == -1 || id2 == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id1, id2](const auto& elem) {
                                       return (elem.variable_index_a == id1 &&
                                               elem.variable_index_b == id2) ||
                                              (elem.variable_index_a == id2 &&
                                               elem.variable_index_b == id1);
                                   });
            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id1;
                ret.variable_index_b = id2;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }

            buf.pop_front(2);
        } else if (buf.first() == "^" || buf.first() == "^2") {
            if (buf.first() == "^" && buf.second() == "2")
                buf.pop_front(2);
            else
                buf.pop_front(1);

            auto id = p.get_or_assign_variable(fct.name);
            if (id == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index_a == id &&
                                              elem.variable_index_b == id;
                                   });

            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id;
                ret.variable_index_b = id;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }
        }
    }

    buf.pop_front();

    if (buf.first() == "/" && buf.second() == "2")
        buf.pop_front(2);
    else if (buf.first() == "/2")
        buf.pop_front(1);
    else
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    return baryonyx::file_format_error_tag::success;
}